

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_from_keypair(mbedtls_ecdsa_context *ctx,mbedtls_ecp_keypair *key)

{
  int local_1c;
  int ret;
  mbedtls_ecp_keypair *key_local;
  mbedtls_ecdsa_context *ctx_local;
  
  local_1c = mbedtls_ecp_group_copy(&ctx->grp,&key->grp);
  if (((local_1c == 0) && (local_1c = mbedtls_mpi_copy(&ctx->d,&key->d), local_1c == 0)) &&
     (local_1c = mbedtls_ecp_copy(&ctx->Q,&key->Q), local_1c == 0)) {
    return 0;
  }
  mbedtls_ecdsa_free(ctx);
  return local_1c;
}

Assistant:

int mbedtls_ecdsa_from_keypair(mbedtls_ecdsa_context *ctx, const mbedtls_ecp_keypair *key)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    if ((ret = mbedtls_ecp_group_copy(&ctx->grp, &key->grp)) != 0 ||
        (ret = mbedtls_mpi_copy(&ctx->d, &key->d)) != 0 ||
        (ret = mbedtls_ecp_copy(&ctx->Q, &key->Q)) != 0) {
        mbedtls_ecdsa_free(ctx);
    }

    return ret;
}